

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.cpp
# Opt level: O2

db_bits * __thiscall lan::db::read_all_bits(db *this,string *content)

{
  db_bit *pdVar1;
  db_bit *pdVar2;
  db_bit *pdVar3;
  string str;
  undefined1 *local_40;
  undefined8 local_38;
  undefined1 local_30 [16];
  
  local_40 = local_30;
  local_38 = 0;
  local_30[0] = 0;
  pdVar1 = read_bit(this,content);
  pdVar3 = pdVar1;
  while (pdVar3 != (db_bit *)0x0) {
    pdVar2 = read_bit(this,content);
    pdVar3->nex = pdVar2;
    pdVar3 = pdVar2;
  }
  std::__cxx11::string::~string((string *)&local_40);
  return pdVar1;
}

Assistant:

lan::db_bits * db::read_all_bits(std::string content){
            std::string str;
            db_bit * bit = nullptr, * f_bit;
            f_bit = bit = read_bit(content);
            while(bit) {
                bit->nex = read_bit(content);
                bit = bit->nex;
            } return f_bit;
        }